

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

_Bool Curl_xfer_is_blocked(Curl_easy *data)

{
  uint uVar1;
  _Bool _Var2;
  bool bVar3;
  
  uVar1 = (data->req).keepon;
  if ((uVar1 & 2) == 0) {
    if ((uVar1 & 1) != 0) {
LAB_00158a39:
      _Var2 = Curl_cwriter_is_paused(data);
      return _Var2;
    }
    _Var2 = false;
  }
  else {
    bVar3 = (uVar1 & 1) == 0;
    _Var2 = Curl_creader_is_paused(data);
    if ((~_Var2 & 1U) == 0 && !bVar3) goto LAB_00158a39;
    _Var2 = bVar3 && _Var2;
  }
  return _Var2;
}

Assistant:

bool Curl_xfer_is_blocked(struct Curl_easy *data)
{
  bool want_send = ((data)->req.keepon & KEEP_SEND);
  bool want_recv = ((data)->req.keepon & KEEP_RECV);
  if(!want_send)
    return (want_recv && Curl_cwriter_is_paused(data));
  else if(!want_recv)
    return (want_send && Curl_creader_is_paused(data));
  else
    return Curl_creader_is_paused(data) && Curl_cwriter_is_paused(data);
}